

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# menudef.cpp
# Opt level: O1

void M_StartupSkillMenu(FGameStartup *gs)

{
  TArray<FListMenuItem_*,_FListMenuItem_*> *this;
  int *piVar1;
  char *text;
  FListMenuItem **ppFVar2;
  bool bVar3;
  Node *pNVar4;
  int y;
  uint uVar5;
  FTextureID patch;
  EColorRange color;
  long *plVar6;
  FMenuDescriptor *pFVar7;
  Node *pNVar8;
  FOptionMenuItem *this_00;
  FListMenuItemText *this_01;
  FString *pFVar9;
  int iVar10;
  int iVar11;
  Node *pNVar12;
  char *pcVar13;
  FSkillInfo *pFVar14;
  int iVar15;
  int iVar16;
  ulong uVar17;
  FString *pFVar18;
  ulong uVar19;
  uint uVar20;
  long *plVar21;
  FName n;
  FName local_48;
  FName local_44;
  long *local_40;
  TArray<FListMenuItem_*,_FListMenuItem_*> *local_38;
  
  plVar21 = (long *)((long)&(MenuDescriptors.Nodes)->Next +
                    (ulong)((MenuDescriptors.Size - 1 & 0x1f7) * 0x18));
  do {
    plVar6 = plVar21;
    if ((plVar6 == (long *)0x0) || ((long *)*plVar6 == (long *)0x1)) {
      plVar6 = (long *)0x0;
      break;
    }
    plVar21 = (long *)*plVar6;
  } while ((int)plVar6[1] != 0x1f7);
  plVar21 = plVar6 + 2;
  if (plVar6 == (long *)0x0) {
    plVar21 = (long *)0x0;
LAB_0030eddc:
    bVar3 = false;
  }
  else {
    plVar6 = (long *)*plVar21;
    if ((int)plVar6[3] != 0) goto LAB_0030eddc;
    iVar10 = *(int *)((long)plVar6 + 0x4c);
    y = (int)plVar6[10];
    this = (TArray<FListMenuItem_*,_FListMenuItem_*> *)(plVar6 + 5);
    if (*(int *)((long)plVar6 + 0x34) != 0) {
      uVar19 = 0;
LAB_0030ed9f:
      (*this->Array[uVar19]->_vptr_FListMenuItem[7])(&n,this->Array[uVar19],0);
      if ((n.Index & 0xfffffffeU) != 0x1f8) goto code_r0x0030edc4;
      uVar20 = (uint)uVar19;
      if (uVar20 < *(uint *)((long)plVar6 + 0x34)) {
        do {
          if (this->Array[uVar19] != (FListMenuItem *)0x0) {
            (*this->Array[uVar19]->_vptr_FListMenuItem[1])();
          }
          uVar19 = uVar19 + 1;
        } while (uVar19 < *(uint *)((long)plVar6 + 0x34));
      }
      TArray<FListMenuItem_*,_FListMenuItem_*>::Resize(this,uVar20);
    }
LAB_0030f093:
    uVar20 = AllSkills.Count;
    if (M_StartupSkillMenu::done == restart) {
LAB_0030f19b:
      iVar16 = *(int *)((long)plVar6 + 0x34);
      if (AllSkills.Count != 0) {
        uVar19 = 0;
        local_40 = plVar21;
        local_38 = this;
        do {
          uVar20 = 0x1f8;
          if (AllSkills.Array[uVar19].MustConfirm == true) {
            uVar20 = AllEpisodes.Array[gs->Episode].mNoSkill ^ 0x1f9;
          }
          pFVar14 = AllSkills.Array + uVar19;
          if (gs->PlayerClass == (char *)0x0) {
            pFVar18 = (FString *)0x0;
          }
          else {
            uVar5 = FName::NameManager::FindName(&FName::NameData,gs->PlayerClass,false);
            pNVar4 = (pFVar14->MenuNamesForPlayerClass).Nodes +
                     ((pFVar14->MenuNamesForPlayerClass).Size - 1 & uVar5);
            do {
              pNVar12 = pNVar4;
              if ((pNVar12 == (Node *)0x0) || (pNVar12->Next == (Node *)0x1)) {
                pNVar12 = (Node *)0x0;
                break;
              }
              pNVar4 = pNVar12->Next;
            } while ((pNVar12->Pair).Key.Index != uVar5);
            pFVar18 = &(pNVar12->Pair).Value;
            if (pNVar12 == (Node *)0x0) {
              pFVar18 = (FString *)0x0;
            }
          }
          if ((pFVar18 == (FString *)0x0) &&
             (pcVar13 = (pFVar14->PicName).Chars, *(int *)(pcVar13 + -0xc) != 0)) {
            patch = GetMenuTexture(pcVar13);
            this_01 = (FListMenuItemText *)operator_new(0x28);
            local_44.Index = uVar20;
            FListMenuItemPatch::FListMenuItemPatch
                      ((FListMenuItemPatch *)this_01,*(int *)((long)plVar6 + 0x4c),y,
                       *(int *)((long)plVar6 + 0x5c),(int)pFVar14->Shortcut,patch,&local_44,
                       (int)uVar19);
          }
          else {
            color = FSkillInfo::GetTextColor(pFVar14);
            if (color == CR_UNTRANSLATED) {
              color = *(EColorRange *)(plVar6 + 0xe);
            }
            this_01 = (FListMenuItemText *)operator_new(0x40);
            pFVar9 = &pFVar14->MenuName;
            if (pFVar18 != (FString *)0x0) {
              pFVar9 = pFVar18;
            }
            local_48.Index = uVar20;
            FListMenuItemText::FListMenuItemText
                      (this_01,iVar10,y,*(int *)((long)plVar6 + 0x5c),(int)pFVar14->Shortcut,
                       pFVar9->Chars,(FFont *)plVar6[0xd],color,
                       *(EColorRange *)((long)plVar6 + 0x74),&local_48,(int)uVar19);
          }
          TArray<FListMenuItem_*,_FListMenuItem_*>::Grow(local_38,1);
          uVar20 = *(uint *)((long)plVar6 + 0x34);
          *(FListMenuItemText **)(plVar6[5] + (ulong)uVar20 * 8) = this_01;
          *(uint *)((long)plVar6 + 0x34) = uVar20 + 1;
          y = y + *(int *)((long)plVar6 + 0x5c);
          uVar19 = uVar19 + 1;
          plVar21 = local_40;
        } while (uVar19 < AllSkills.Count);
      }
      if ((AllSkills.Count == 1) || (iVar10 = -1, AllEpisodes.Array[gs->Episode].mNoSkill != false))
      {
        uVar20 = AllSkills.Count - 1 >> 1;
        if ((uint)DefaultSkill < AllSkills.Count) {
          uVar20 = DefaultSkill;
        }
        iVar10 = uVar20 + iVar16;
      }
      *(int *)(plVar6 + 0xc) = iVar10;
      bVar3 = true;
      iVar11 = 0;
    }
    else {
      M_StartupSkillMenu::done = restart;
      uVar5 = AllSkills.Count - 1 >> 1;
      if ((uint)DefaultSkill < AllSkills.Count) {
        uVar5 = DefaultSkill;
      }
      uVar19 = (ulong)*(uint *)((long)plVar6 + 0x34);
      *(uint *)(plVar6 + 7) = uVar5 + *(uint *)((long)plVar6 + 0x34);
      iVar16 = y;
      if (uVar19 != 0) {
        uVar17 = 0;
        do {
          iVar15 = this->Array[uVar17]->mYpos;
          if (iVar15 < iVar16) {
            iVar16 = iVar15;
          }
          uVar17 = uVar17 + 1;
        } while (uVar19 != uVar17);
      }
      iVar15 = (y - iVar16) + *(int *)((long)plVar6 + 0x5c) * uVar20;
      if (uVar20 != 1 && 0xbd < iVar15) {
        if (plVar6 != (long *)0x0) {
          (**(code **)(*plVar6 + 8))(plVar6);
        }
        M_StartupSkillMenu::done = 0;
        iVar11 = 0xe;
        plVar21 = (long *)0x0;
      }
      else {
        iVar11 = 0;
        iVar16 = (((iVar16 - iVar15) - ((iVar16 - iVar15) + 200 >> 0x1f)) + 200 >> 1) - iVar16;
        if (iVar16 < 0) {
          if (uVar19 != 0) {
            ppFVar2 = this->Array;
            uVar17 = 0;
            do {
              piVar1 = &ppFVar2[uVar17]->mYpos;
              *piVar1 = *piVar1 + iVar16;
              uVar17 = uVar17 + 1;
            } while (uVar19 != uVar17);
          }
          y = y - iVar16;
          *(int *)(plVar6 + 10) = y;
        }
      }
      if (uVar20 == 1 || 0xbd >= iVar15) goto LAB_0030f19b;
      bVar3 = false;
    }
    if (iVar11 == 0xe) goto LAB_0030ede6;
    if (iVar11 != 0) {
      return;
    }
  }
  if (bVar3) {
    return;
  }
LAB_0030ede6:
  if (plVar21 == (long *)0x0) {
    pFVar7 = (FMenuDescriptor *)operator_new(0x60);
    pFVar7->_vptr_FMenuDescriptor = (_func_int **)&PTR__FMenuDescriptor_006f1d88;
    (pFVar7->mMenuName).Index = 0;
    (pFVar7->mNetgameMessage).Chars = FString::NullString.Nothing;
    pFVar7->_vptr_FMenuDescriptor = (_func_int **)&PTR__FOptionMenuDescriptor_006f1da8;
    pFVar7[1]._vptr_FMenuDescriptor = (_func_int **)0x0;
    *(undefined8 *)&pFVar7[1].mMenuName = 0;
    pFVar7[1].mNetgameMessage.Chars = FString::NullString.Nothing;
    FString::NullString.RefCount = FString::NullString.RefCount + 2;
    n.Index = 0x1f7;
    pNVar8 = TMap<FName,_FMenuDescriptor_*,_THashTraits<FName>,_TValueTraits<FMenuDescriptor_*>_>::
             GetNode(&MenuDescriptors,&n);
    (pNVar8->Pair).Value = pFVar7;
    pFVar7->mType = 1;
    (pFVar7->mMenuName).Index = 0x1f7;
    FString::operator=(&pFVar7[1].mNetgameMessage,"$MNU_CHOOSESKILL");
    pFVar7[1].mType = 0;
    pFVar7->mClass = (PClass *)0x0;
    pFVar7[1].mClass = (PClass *)0x0;
    pFVar7[2]._vptr_FMenuDescriptor = (_func_int **)0xfffffff1000000a0;
    *(undefined1 *)&pFVar7[2].mMenuName.Index = 0;
  }
  else {
    pFVar7 = (FMenuDescriptor *)*plVar21;
    if (*(int *)&pFVar7[1].field_0xc != 0) {
      uVar19 = 0;
      do {
        if (pFVar7[1]._vptr_FMenuDescriptor[uVar19] != (_func_int *)0x0) {
          (**(code **)(*(long *)pFVar7[1]._vptr_FMenuDescriptor[uVar19] + 8))();
        }
        uVar19 = uVar19 + 1;
      } while (uVar19 < *(uint *)&pFVar7[1].field_0xc);
      if (*(uint *)&pFVar7[1].field_0xc != 0) {
        *(undefined4 *)&pFVar7[1].field_0xc = 0;
      }
    }
  }
  if (AllSkills.Count != 0) {
    uVar19 = 0;
    do {
      pFVar14 = AllSkills.Array;
      pcVar13 = "Startgame";
      if ((AllSkills.Array[uVar19].MustConfirm == true) &&
         (pcVar13 = "StartgameConfirm", AllEpisodes.Array[gs->Episode].mNoSkill != false)) {
        pcVar13 = "Startgame";
      }
      if (gs->PlayerClass == (char *)0x0) {
        pFVar18 = (FString *)0x0;
      }
      else {
        uVar20 = FName::NameManager::FindName(&FName::NameData,gs->PlayerClass,false);
        pNVar4 = pFVar14[uVar19].MenuNamesForPlayerClass.Nodes +
                 (pFVar14[uVar19].MenuNamesForPlayerClass.Size - 1 & uVar20);
        do {
          pNVar12 = pNVar4;
          if ((pNVar12 == (Node *)0x0) || (pNVar12->Next == (Node *)0x1)) {
            pNVar12 = (Node *)0x0;
            break;
          }
          pNVar4 = pNVar12->Next;
        } while ((pNVar12->Pair).Key.Index != uVar20);
        pFVar18 = &(pNVar12->Pair).Value;
        if (pNVar12 == (Node *)0x0) {
          pFVar18 = (FString *)0x0;
        }
      }
      this_00 = (FOptionMenuItem *)operator_new(0x28);
      pFVar9 = &pFVar14[uVar19].MenuName;
      if (pFVar18 != (FString *)0x0) {
        pFVar9 = pFVar18;
      }
      text = pFVar9->Chars;
      n.Index = FName::NameManager::FindName(&FName::NameData,pcVar13,false);
      FOptionMenuItem::FOptionMenuItem(this_00,text,&n,false);
      (this_00->super_FListMenuItem)._vptr_FListMenuItem =
           (_func_int **)&PTR__FOptionMenuItem_006f0d88;
      *(int *)&this_00->field_0x24 = (int)uVar19;
      TArray<FOptionMenuItem_*,_FOptionMenuItem_*>::Grow
                ((TArray<FOptionMenuItem_*,_FOptionMenuItem_*> *)(pFVar7 + 1),1);
      uVar20 = *(uint *)&pFVar7[1].field_0xc;
      pFVar7[1]._vptr_FMenuDescriptor[uVar20] = (_func_int *)this_00;
      *(uint *)&pFVar7[1].field_0xc = uVar20 + 1;
      if (M_StartupSkillMenu::done == 0) {
        M_StartupSkillMenu::done = 1;
        uVar20 = AllSkills.Count - 1 >> 1;
        if ((uint)DefaultSkill < AllSkills.Count) {
          uVar20 = DefaultSkill;
        }
        pFVar7[1].mType = uVar20;
      }
      uVar19 = uVar19 + 1;
    } while (uVar19 < AllSkills.Count);
  }
  return;
code_r0x0030edc4:
  uVar19 = uVar19 + 1;
  if (*(uint *)((long)plVar6 + 0x34) <= uVar19) goto LAB_0030f093;
  goto LAB_0030ed9f;
}

Assistant:

void M_StartupSkillMenu(FGameStartup *gs)
{
	static int done = -1;
	bool success = false;
	FMenuDescriptor **desc = MenuDescriptors.CheckKey(NAME_Skillmenu);
	if (desc != NULL)
	{
		if ((*desc)->mType == MDESC_ListMenu)
		{
			FListMenuDescriptor *ld = static_cast<FListMenuDescriptor*>(*desc);
			int x = ld->mXpos;
			int y = ld->mYpos;

			// Delete previous contents
			for(unsigned i=0; i<ld->mItems.Size(); i++)
			{
				FName n = ld->mItems[i]->GetAction(NULL);
				if (n == NAME_Startgame || n == NAME_StartgameConfirm) 
				{
					for(unsigned j=i; j<ld->mItems.Size(); j++)
					{
						delete ld->mItems[j];
					}
					ld->mItems.Resize(i);
					break;
				}
			}

			if (done != restart)
			{
				done = restart;
				int defskill = DefaultSkill;
				if ((unsigned int)defskill >= AllSkills.Size())
				{
					defskill = (AllSkills.Size() - 1) / 2;
				}
				ld->mSelectedItem = ld->mItems.Size() + defskill;

				int posy = y;
				int topy = posy;

				// Get lowest y coordinate of any static item in the menu
				for(unsigned i = 0; i < ld->mItems.Size(); i++)
				{
					int y = ld->mItems[i]->GetY();
					if (y < topy) topy = y;
				}

				// center the menu on the screen if the top space is larger than the bottom space
				int totalheight = posy + AllSkills.Size() * ld->mLinespacing - topy;

				if (totalheight < 190 || AllSkills.Size() == 1)
				{
					int newtop = (200 - totalheight + topy) / 2;
					int topdelta = newtop - topy;
					if (topdelta < 0)
					{
						for(unsigned i = 0; i < ld->mItems.Size(); i++)
						{
							ld->mItems[i]->OffsetPositionY(topdelta);
						}
						y = ld->mYpos = posy - topdelta;
					}
				}
				else
				{
					// too large
					delete ld;
					desc = NULL;
					done = false;
					goto fail;
				}
			}

			unsigned firstitem = ld->mItems.Size();
			for(unsigned int i = 0; i < AllSkills.Size(); i++)
			{
				FSkillInfo &skill = AllSkills[i];
				FListMenuItem *li;
				// Using a different name for skills that must be confirmed makes handling this easier.
				FName action = (skill.MustConfirm && !AllEpisodes[gs->Episode].mNoSkill) ?
					NAME_StartgameConfirm : NAME_Startgame;
				FString *pItemText = NULL;
				if (gs->PlayerClass != NULL)
				{
					pItemText = skill.MenuNamesForPlayerClass.CheckKey(gs->PlayerClass);
				}

				if (skill.PicName.Len() != 0 && pItemText == NULL)
				{
					FTextureID tex = GetMenuTexture(skill.PicName);
					li = new FListMenuItemPatch(ld->mXpos, y, ld->mLinespacing, skill.Shortcut, tex, action, i);
				}
				else
				{
					EColorRange color = (EColorRange)skill.GetTextColor();
					if (color == CR_UNTRANSLATED) color = ld->mFontColor;
					li = new FListMenuItemText(x, y, ld->mLinespacing, skill.Shortcut, 
									pItemText? *pItemText : skill.MenuName, ld->mFont, color,ld->mFontColor2, action, i);
				}
				ld->mItems.Push(li);
				y += ld->mLinespacing;
			}
			if (AllEpisodes[gs->Episode].mNoSkill || AllSkills.Size() == 1)
			{
				ld->mAutoselect = firstitem + M_GetDefaultSkill();
			}
			else
			{
				ld->mAutoselect = -1;
			}
			success = true;
		}
	}
	if (success) return;
fail:
	// Option menu fallback for overlong skill lists
	FOptionMenuDescriptor *od;
	if (desc == NULL)
	{
		od = new FOptionMenuDescriptor;
		if (desc != NULL) delete *desc;
		MenuDescriptors[NAME_Skillmenu] = od;
		od->mType = MDESC_OptionsMenu;
		od->mMenuName = NAME_Skillmenu;
		od->mTitle = "$MNU_CHOOSESKILL";
		od->mSelectedItem = 0;
		od->mScrollPos = 0;
		od->mClass = NULL;
		od->mPosition = -15;
		od->mScrollTop = 0;
		od->mIndent = 160;
		od->mDontDim = false;
	}
	else
	{
		od = static_cast<FOptionMenuDescriptor*>(*desc);
		for(unsigned i=0;i<od->mItems.Size(); i++)
		{
			delete od->mItems[i];
		}
		od->mItems.Clear();
	}
	for(unsigned int i = 0; i < AllSkills.Size(); i++)
	{
		FSkillInfo &skill = AllSkills[i];
		FOptionMenuItem *li;
		// Using a different name for skills that must be confirmed makes handling this easier.
		const char *action = (skill.MustConfirm && !AllEpisodes[gs->Episode].mNoSkill) ?
			"StartgameConfirm" : "Startgame";

		FString *pItemText = NULL;
		if (gs->PlayerClass != NULL)
		{
			pItemText = skill.MenuNamesForPlayerClass.CheckKey(gs->PlayerClass);
		}
		li = new FOptionMenuItemSubmenu(pItemText? *pItemText : skill.MenuName, action, i);
		od->mItems.Push(li);
		if (!done)
		{
			done = true;
			od->mSelectedItem = M_GetDefaultSkill();
		}
	}
}